

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

tm * __thiscall cmCTest::GetNightlyTime(cmCTest *this,string *str,bool tomorrowtag)

{
  char cVar1;
  undefined4 uVar2;
  tm *ptVar3;
  ostream *poVar4;
  long lVar5;
  undefined7 in_register_00000011;
  time_t ntime;
  time_t tctime;
  ostringstream cmCTestLog_msg;
  char buf [1024];
  long *local_5f0;
  long local_5e0 [2];
  time_t local_5d0;
  cmCTest *local_5c8;
  time_t local_5c0;
  undefined4 local_5b4;
  long local_5b0 [14];
  ios_base local_540 [264];
  char local_438 [1032];
  
  local_5c8 = this;
  local_5c0 = time((time_t *)0x0);
  ptVar3 = gmtime(&local_5c0);
  sprintf(local_438,"%d%02d%02d %s",(ulong)(ptVar3->tm_year + 0x76c),(ulong)(ptVar3->tm_mon + 1),
          (ulong)(uint)ptVar3->tm_mday);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5b0,"Determine Nightly Start Time",0x1c);
  std::ios::widen((char)(ostringstream *)local_5b0 + (char)*(undefined8 *)(local_5b0[0] + -0x18));
  std::ostream::put((char)local_5b0);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"   Specified time: ",0x13);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(str->_M_dataplus)._M_p,str->_M_string_length);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_5c8,1,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x54,(char *)local_5f0,false);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  local_5d0 = curl_getdate(local_438,&local_5c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"   Get curl time: ",0x12)
  ;
  poVar4 = std::ostream::_M_insert<long>((long)local_5b0);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_5c8,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x5c,(char *)local_5f0,false);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  local_5c0 = time((time_t *)0x0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5b0,"   Get the current time: ",0x19);
  poVar4 = std::ostream::_M_insert<long>((long)local_5b0);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_5c8,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x5e,(char *)local_5f0,false);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"Seconds: ",9);
  poVar4 = std::ostream::_M_insert<long>((long)local_5b0);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_5c8,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x61,(char *)local_5f0,false);
  local_5b4 = (undefined4)CONCAT71(in_register_00000011,tomorrowtag);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  if (local_5c0 < local_5d0) {
    do {
      local_5d0 = local_5d0 + -0x15180;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"Pick yesterday",0xe);
      cVar1 = (char)(ostringstream *)local_5b0;
      std::ios::widen((char)*(undefined8 *)(local_5b0[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(local_5c8,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
          ,0x6a,(char *)local_5f0,false);
      if (local_5f0 != local_5e0) {
        operator_delete(local_5f0,local_5e0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
      std::ios_base::~ios_base(local_540);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b0,"   Future time, subtract day: ",0x1e);
      poVar4 = std::ostream::_M_insert<long>((long)local_5b0);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(local_5c8,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
          ,0x6c,(char *)local_5f0,false);
      if (local_5f0 != local_5e0) {
        operator_delete(local_5f0,local_5e0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
      std::ios_base::~ios_base(local_540);
    } while (local_5c0 < local_5d0);
  }
  lVar5 = local_5d0 + 0x15180;
  if (lVar5 < local_5c0) {
    do {
      local_5d0 = lVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b0,"   Past time, add day: ",0x17);
      poVar4 = std::ostream::_M_insert<long>((long)local_5b0);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(local_5c8,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
          ,0x71,(char *)local_5f0,false);
      if (local_5f0 != local_5e0) {
        operator_delete(local_5f0,local_5e0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
      std::ios_base::~ios_base(local_540);
      lVar5 = local_5d0 + 0x15180;
    } while (lVar5 < local_5c0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"nightlySeconds: ",0x10);
  poVar4 = std::ostream::_M_insert<long>((long)local_5b0);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  uVar2 = local_5b4;
  Log(local_5c8,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x73,(char *)local_5f0,false);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"   Current time: ",0x11);
  poVar4 = std::ostream::_M_insert<long>((long)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Nightly time: ",0xf);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_5c8,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x75,(char *)local_5f0,false);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  if ((char)uVar2 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b0,"   Use future tag, Add a day",0x1c);
    std::ios::widen((char)(ostringstream *)local_5b0 + (char)*(undefined8 *)(local_5b0[0] + -0x18));
    std::ostream::put((char)local_5b0);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_5c8,1,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x78,(char *)local_5f0,false);
    if (local_5f0 != local_5e0) {
      operator_delete(local_5f0,local_5e0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
    std::ios_base::~ios_base(local_540);
    local_5d0 = local_5d0 + 0x15180;
  }
  ptVar3 = gmtime(&local_5d0);
  return (tm *)ptVar3;
}

Assistant:

struct tm* cmCTest::GetNightlyTime(std::string str,
                                   bool tomorrowtag)
{
  struct tm* lctime;
  time_t tctime = time(0);
  lctime = gmtime(&tctime);
  char buf[1024];
  // add todays year day and month to the time in str because
  // curl_getdate no longer assumes the day is today
  sprintf(buf, "%d%02d%02d %s",
          lctime->tm_year+1900,
          lctime->tm_mon +1,
          lctime->tm_mday,
          str.c_str());
  cmCTestLog(this, OUTPUT, "Determine Nightly Start Time" << std::endl
    << "   Specified time: " << str << std::endl);
  //Convert the nightly start time to seconds. Since we are
  //providing only a time and a timezone, the current date of
  //the local machine is assumed. Consequently, nightlySeconds
  //is the time at which the nightly dashboard was opened or
  //will be opened on the date of the current client machine.
  //As such, this time may be in the past or in the future.
  time_t ntime = curl_getdate(buf, &tctime);
  cmCTestLog(this, DEBUG, "   Get curl time: " << ntime << std::endl);
  tctime = time(0);
  cmCTestLog(this, DEBUG, "   Get the current time: " << tctime << std::endl);

  const int dayLength = 24 * 60 * 60;
  cmCTestLog(this, DEBUG, "Seconds: " << tctime << std::endl);
  while ( ntime > tctime )
    {
    // If nightlySeconds is in the past, this is the current
    // open dashboard, then return nightlySeconds.  If
    // nightlySeconds is in the future, this is the next
    // dashboard to be opened, so subtract 24 hours to get the
    // time of the current open dashboard
    ntime -= dayLength;
    cmCTestLog(this, DEBUG, "Pick yesterday" << std::endl);
    cmCTestLog(this, DEBUG, "   Future time, subtract day: " << ntime
      << std::endl);
    }
  while ( tctime > (ntime + dayLength) )
    {
    ntime += dayLength;
    cmCTestLog(this, DEBUG, "   Past time, add day: " << ntime << std::endl);
    }
  cmCTestLog(this, DEBUG, "nightlySeconds: " << ntime << std::endl);
  cmCTestLog(this, DEBUG, "   Current time: " << tctime
    << " Nightly time: " << ntime << std::endl);
  if ( tomorrowtag )
    {
    cmCTestLog(this, OUTPUT, "   Use future tag, Add a day" << std::endl);
    ntime += dayLength;
    }
  lctime = gmtime(&ntime);
  return lctime;
}